

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void dfg_deploy_handler(CManager cm,CMConnection conn,void *vmsg,void *client_data,attr_list attrs)

{
  uint uVar1;
  event_path_data evp;
  EVstone EVar2;
  int iVar3;
  action_value aVar4;
  __pid_t _Var5;
  long lVar6;
  lookup_table_elem *plVar7;
  attr_list stone_attrs;
  CMFormat format;
  pthread_t pVar8;
  long lVar9;
  char *__format;
  FILE *pFVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  EVdeploy_ack_msg response_msg;
  timespec ts;
  void *local_1080;
  undefined8 local_1040;
  timespec local_1038 [256];
  
  evp = cm->evp;
  iVar3 = evp->stone_lookup_table_size;
  lVar6 = (long)iVar3;
  local_1080 = INT_CMmalloc(0xc);
  iVar11 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar11 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar11 != 0) {
    if (CMtrace_PID != 0) {
      pFVar10 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar8 = pthread_self();
      fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,local_1038);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_1038[0].tv_sec,local_1038[0].tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Client %d getting Deploy message\n",
            (ulong)*(uint *)((long)client_data + 0x30));
  }
  fflush((FILE *)cm->CMTrace_file);
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x524);
  if (evp->stone_lookup_table_size == 0) {
    plVar7 = (lookup_table_elem *)INT_CMmalloc((long)*(int *)((long)vmsg + 8) << 3);
  }
  else {
    plVar7 = (lookup_table_elem *)
             INT_CMrealloc(evp->stone_lookup_table,(*(int *)((long)vmsg + 8) + lVar6) * 8);
  }
  evp->stone_lookup_table = plVar7;
  iVar11 = 0;
  lVar9 = 0;
  if (0 < *(int *)((long)vmsg + 8)) {
    lVar13 = 0;
    lVar9 = 0;
    lVar14 = lVar6;
    do {
      evp->stone_lookup_table[lVar14].global_id = *(int *)(*(long *)((long)vmsg + 0x10) + lVar13);
      EVar2 = INT_EValloc_stone(cm);
      evp->stone_lookup_table[lVar14].local_id = EVar2;
      lVar9 = lVar9 + 1;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x40;
    } while (lVar9 < *(int *)((long)vmsg + 8));
  }
  evp->stone_lookup_table_size = iVar3 + (int)lVar9;
  if (0 < *(int *)((long)vmsg + 8)) {
    lVar9 = 0;
    iVar11 = 0;
    do {
      EVar2 = evp->stone_lookup_table[lVar6 + lVar9].local_id;
      lVar14 = lVar9 * 0x40;
      if (*(long *)(*(long *)((long)vmsg + 0x10) + 8 + lVar14) != 0) {
        stone_attrs = (attr_list)attr_list_from_string();
        INT_EVset_attr_list(cm,EVar2,stone_attrs);
        free_attr_list(stone_attrs);
      }
      lVar13 = *(long *)((long)vmsg + 0x10);
      iVar3 = *(int *)(lVar13 + 0x18 + lVar14);
      if (0 < iVar3) {
        lVar12 = 0;
        do {
          iVar3 = *(int *)(*(long *)(lVar13 + 0x20 + lVar14) + lVar12 * 4);
          if (iVar3 == -1) {
            *(undefined4 *)((long)&local_1038[0].tv_sec + lVar12 * 4) = 0xffffffff;
          }
          else {
            iVar3 = lookup_local_stone(evp,iVar3);
            *(int *)((long)&local_1038[0].tv_sec + lVar12 * 4) = iVar3;
            if (iVar3 == -1) {
              printf("Didn\'t found global stone %d\n",
                     (ulong)*(uint *)(*(long *)(*(long *)((long)vmsg + 0x10) + 0x20 + lVar14) +
                                     lVar12 * 4));
            }
          }
          lVar12 = lVar12 + 1;
          lVar13 = *(long *)((long)vmsg + 0x10);
          iVar3 = *(int *)(lVar13 + 0x18 + lVar14);
        } while (lVar12 < iVar3);
      }
      *(undefined4 *)((long)&local_1038[0].tv_sec + (long)iVar3 * 4) = 0xffffffff;
      INT_EVassoc_general_action(cm,EVar2,*(char **)(lVar13 + 0x28 + lVar14),(EVstone *)local_1038);
      lVar13 = *(long *)((long)vmsg + 0x10);
      if (0 < *(int *)(lVar13 + 0x30 + lVar14)) {
        lVar12 = 0;
        do {
          INT_EVassoc_general_action
                    (cm,EVar2,*(char **)(*(long *)(lVar13 + 0x38 + lVar14) + lVar12 * 8),
                     (EVstone *)local_1038);
          lVar12 = lVar12 + 1;
          lVar13 = *(long *)((long)vmsg + 0x10);
        } while (lVar12 < *(int *)(lVar13 + 0x30 + lVar14));
      }
      if (*(int *)(lVar13 + 0x10 + lVar14) != -1) {
        lVar13 = (long)iVar11;
        local_1080 = INT_CMrealloc(local_1080,lVar13 * 0xc + 0x18);
        *(EVstone *)((long)local_1080 + lVar13 * 0xc) = EVar2;
        *(undefined8 *)((long)local_1080 + lVar13 * 0xc + 4) =
             *(undefined8 *)(*(long *)((long)vmsg + 0x10) + 0x10 + lVar14);
        iVar11 = iVar11 + 1;
      }
      aVar4 = action_type(*(char **)(*(long *)((long)vmsg + 0x10) + 0x28 + lVar14));
      if (aVar4 == Action_Terminal) {
        *(int *)((long)client_data + 0x44) = *(int *)((long)client_data + 0x44) + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)((long)vmsg + 8));
  }
  *(undefined4 *)((long)local_1080 + (long)iVar11 * 0xc + 4) = 0xffffffff;
  if (conn == (CMConnection)0x0) {
    iVar3 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar3 == 0) goto LAB_00145b4c;
    if (CMtrace_PID != 0) {
      pFVar10 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar8 = pthread_self();
      fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,local_1038);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_1038[0].tv_sec,local_1038[0].tv_nsec);
    }
    pFVar10 = (FILE *)cm->CMTrace_file;
    uVar1 = *(uint *)((long)client_data + 0x30);
    __format = "Client %d no master conn\n";
  }
  else {
    format = INT_CMlookup_format(*client_data,EVdfg_deploy_ack_format_list);
    local_1040 = *vmsg;
    INT_CMwrite(*(CMConnection *)((long)client_data + 0x20),format,&local_1040);
    iVar3 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar3 == 0) goto LAB_00145b4c;
    if (CMtrace_PID != 0) {
      pFVar10 = (FILE *)cm->CMTrace_file;
      _Var5 = getpid();
      pVar8 = pthread_self();
      fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,local_1038);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_1038[0].tv_sec,local_1038[0].tv_nsec);
    }
    pFVar10 = (FILE *)cm->CMTrace_file;
    uVar1 = *(uint *)((long)client_data + 0x30);
    __format = "Client %d wrote deploy ack\n";
  }
  fprintf(pFVar10,__format,(ulong)uVar1);
LAB_00145b4c:
  fflush((FILE *)cm->CMTrace_file);
  if (dfg_deploy_handler_first_time_deploy == '\0') {
    dfg_deploy_handler_first_time_deploy = '\x01';
  }
  if (iVar11 == 0) {
    free(local_1080);
    local_1080 = (void *)0x0;
  }
  *(void **)((long)client_data + 0x48) = local_1080;
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x56b);
  return;
}

Assistant:

static void
dfg_deploy_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = (EVclient) client_data;
    event_path_data evp = cm->evp;
    (void) conn;
    (void) attrs;
    static int first_time_deploy = 1;
    EVdfg_deploy_ptr msg =  vmsg;
    int i, base = evp->stone_lookup_table_size;
    int auto_stones = 0;
    auto_stone_list *auto_list = malloc(sizeof(auto_stone_list));

    CMtrace_out(cm, EVdfgVerbose, "Client %d getting Deploy message\n", client->my_node_id);

    CManager_lock(cm);
    /* add stones to local lookup table */
    if (evp->stone_lookup_table_size == 0) {
	evp->stone_lookup_table = 
	    malloc(sizeof(evp->stone_lookup_table[0]) * msg->stone_count);
    } else {
	evp->stone_lookup_table = 
	    realloc(evp->stone_lookup_table,
		    sizeof(evp->stone_lookup_table[0]) * (msg->stone_count+base));
    }
    for (i=0; i < msg->stone_count; i++) {
	evp->stone_lookup_table[base + i].global_id = msg->stone_list[i].global_stone_id;
	evp->stone_lookup_table[base + i].local_id = INT_EValloc_stone(cm);
    }
    evp->stone_lookup_table_size = base + i;
    for (i=0; i < msg->stone_count; i++) {
	int local_stone = evp->stone_lookup_table[base + i].local_id;
	int local_list[1024]; /* List of output actions for this stone... better be enough */
	int j;
	if (msg->stone_list[i].attrs != NULL) {
	    attr_list tmp_attrs = attr_list_from_string(msg->stone_list[i].attrs);
	    INT_EVset_attr_list(cm, local_stone, tmp_attrs);
	    free_attr_list(tmp_attrs);
	}
	for (j=0; j < msg->stone_list[i].out_count; j++) {
	    if (msg->stone_list[i].out_links[j] != -1) {
		local_list[j] = lookup_local_stone(evp, msg->stone_list[i].out_links[j]);
		if (local_list[j] == -1) {
		    printf("Didn't found global stone %d\n", msg->stone_list[i].out_links[j]);
		}
	    } else {
		local_list[j] = -1;
	    }
	}
	local_list[msg->stone_list[i].out_count] = -1;
	INT_EVassoc_general_action(cm, local_stone, msg->stone_list[i].action, 
				   &local_list[0]);
	for (j=0; j < msg->stone_list[i].extra_actions; j++) {
	    INT_EVassoc_general_action(cm, local_stone, msg->stone_list[i].xactions[j], 
				       &local_list[0]);
	}	    
	if (msg->stone_list[i].period_secs != -1) {
	    auto_list= realloc(auto_list, sizeof(auto_list[0]) * (auto_stones+2));
	    auto_list[auto_stones].stone = local_stone;
	    auto_list[auto_stones].period_secs = msg->stone_list[i].period_secs;
	    auto_list[auto_stones].period_usecs = msg->stone_list[i].period_usecs;
	    auto_stones++;
	}
	if (action_type(msg->stone_list[i].action) == Action_Terminal) {
	    client->active_sink_count++;
	}
    }    
    auto_list[auto_stones].period_secs = -1;
    if (conn != NULL) {
	CMFormat deploy_ack_msg = INT_CMlookup_format(client->cm, EVdfg_deploy_ack_format_list);
	EVdeploy_ack_msg response_msg;
	response_msg.node_id = msg->canonical_name;
	INT_CMwrite(client->master_connection, deploy_ack_msg, &response_msg);
	CMtrace_out(cm, EVdfgVerbose, "Client %d wrote deploy ack\n", client->my_node_id);
    } else {
      	CMtrace_out(cm, EVdfgVerbose, "Client %d no master conn\n", client->my_node_id);
    }
    if (first_time_deploy) {
	first_time_deploy = 0;
    }
    if (auto_stones == 0) {
	free(auto_list);
	auto_list = NULL;
    }
    client->pending_auto_list = auto_list;
    
    CManager_unlock(cm);
}